

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O0

ClauseIterator Inferences::produceClauses(Clause *c,bool generating,SkolemisingFormulaIndex *index)

{
  undefined8 uVar1;
  TypedTermList t;
  Iterator it;
  bool bVar2;
  int iVar3;
  CNFOnTheFly CVar4;
  uint uVar5;
  Literal **ppLVar6;
  TermList *pTVar7;
  size_t sVar8;
  Term *pTVar9;
  TermList TVar10;
  undefined4 extraout_var;
  TermList arg2;
  Clause *in_RCX;
  byte in_DL;
  Clause *in_RSI;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  Clause *res_5;
  Literal *l1_8;
  TermList skolemTerm_1;
  TermList skolemTerm;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
  tqr;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
  results;
  bool newTermCreated;
  InferenceRule rule;
  TermList newTerm;
  TermList srt_1;
  TermList rhs_2;
  Clause *res_4;
  Literal *l1_7;
  TermList rhs_1;
  Clause *res_3;
  Literal *l1_6;
  TermList srt;
  Clause *res2_4;
  Clause *res1_4;
  Literal *l1_5;
  Literal *l2_5;
  Clause *res_2;
  Literal *l2_4;
  Literal *l1_4;
  Clause *res_1;
  Literal *l2_3;
  Literal *l1_3;
  Clause *res2_3;
  Clause *res1_3;
  Literal *l2_2;
  Literal *l1_2;
  Clause *res2_2;
  Clause *res1_2;
  Literal *l2_1;
  Literal *l1_1;
  Clause *res;
  Literal *l2;
  Literal *l1;
  bool positive;
  Proxy prox;
  Clause *res2_1;
  Clause *res1_1;
  Clause *res2;
  Clause *res1;
  Literal *rhsFols;
  Literal *rhsTroo;
  Literal *lhsFols;
  Literal *lhsTroo;
  TermList boolVal;
  TermList term;
  TermList rhs;
  TermList lhs;
  Literal *lit;
  uint i;
  uint clength;
  ClauseStack resultStack;
  TermList head;
  TermList boolSort;
  TermList fols;
  TermList troo;
  bool not_be;
  TermList in_stack_fffffffffffff6b8;
  Clause *elem;
  TermList in_stack_fffffffffffff6c0;
  Term *in_stack_fffffffffffff6c8;
  TermList in_stack_fffffffffffff6d0;
  TermIndex<Indexing::TermWithValue<Kernel::TermList>_> *in_stack_fffffffffffff6d8;
  TermList in_stack_fffffffffffff6e0;
  SortId in_stack_fffffffffffff6e8;
  TermList in_stack_fffffffffffff6f0;
  TermList in_stack_fffffffffffff6f8;
  TermList in_stack_fffffffffffff700;
  TermList in_stack_fffffffffffff708;
  undefined1 uVar11;
  TermList in_stack_fffffffffffff710;
  TermList in_stack_fffffffffffff718;
  TermList in_stack_fffffffffffff720;
  Term *in_stack_fffffffffffff738;
  undefined8 *local_898;
  undefined8 *local_858;
  Literal *in_stack_fffffffffffff800;
  undefined8 in_stack_fffffffffffff808;
  undefined2 uVar12;
  Literal *in_stack_fffffffffffff810;
  Literal *in_stack_fffffffffffff818;
  Clause *in_stack_fffffffffffff820;
  Clause *c_00;
  Literal *in_stack_fffffffffffff830;
  TermList in_stack_fffffffffffff8f0;
  TermList in_stack_fffffffffffff8f8;
  byte local_532;
  byte local_526;
  byte local_525;
  SmartPtr<Indexing::ResultSubstitution> local_428;
  long local_418;
  byte local_3f1;
  uint64_t local_3f0;
  uint64_t local_3e8;
  uint64_t local_3e0;
  InferenceRule local_3d1;
  TermList local_3d0;
  uint64_t local_3c8;
  uint64_t local_3c0;
  undefined8 local_3b8;
  Clause *local_3b0;
  uint64_t local_3a8;
  undefined8 local_3a0;
  uint64_t local_398;
  Literal *local_390;
  undefined8 local_388;
  Clause *local_380;
  uint64_t local_378;
  uint64_t local_370;
  uint64_t local_368;
  Literal *local_360;
  uint64_t local_358;
  uint64_t local_350;
  Clause *local_348;
  Clause *local_340;
  uint64_t local_338;
  undefined8 local_330;
  uint64_t local_328;
  Literal *local_320;
  uint64_t local_318;
  undefined8 local_310;
  uint64_t local_308;
  Literal *local_300;
  Clause *local_2f8;
  uint64_t local_2f0;
  undefined8 local_2e8;
  uint64_t local_2e0;
  Literal *local_2d8;
  uint64_t local_2d0;
  undefined8 local_2c8;
  uint64_t local_2c0;
  Literal *local_2b8;
  Clause *local_2b0;
  uint64_t local_2a8;
  undefined8 local_2a0;
  uint64_t local_298;
  Literal *local_290;
  uint64_t local_288;
  undefined8 local_280;
  uint64_t local_278;
  Literal *local_270;
  Clause *local_268;
  Clause *local_260;
  uint64_t local_258;
  undefined8 local_250;
  uint64_t local_248;
  Literal *local_240;
  uint64_t local_238;
  undefined8 local_230;
  uint64_t local_228;
  Literal *local_220;
  Clause *local_218;
  Clause *local_210;
  uint64_t local_208;
  undefined8 local_200;
  uint64_t local_1f8;
  Literal *local_1f0;
  uint64_t local_1e8;
  undefined8 local_1e0;
  uint64_t local_1d8;
  Literal *local_1d0;
  Clause *local_1c8;
  uint64_t local_1c0;
  undefined8 local_1b8;
  uint64_t local_1b0;
  Literal *local_1a8;
  uint64_t local_1a0;
  undefined8 local_198;
  uint64_t local_190;
  Literal *local_188;
  uint64_t local_180;
  byte local_171;
  uint64_t local_170;
  Proxy local_164;
  uint64_t local_160;
  Clause *local_158;
  Clause *local_150;
  Clause *local_148;
  Clause *local_140;
  uint64_t local_138;
  undefined8 local_130;
  uint64_t local_128;
  Literal *local_120;
  uint64_t local_118;
  undefined8 local_110;
  uint64_t local_108;
  Literal *local_100;
  uint64_t local_f8;
  undefined8 local_f0;
  uint64_t local_e8;
  Literal *local_e0;
  uint64_t local_d8;
  undefined8 local_d0;
  uint64_t local_c8;
  Literal *local_c0;
  TermList local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  TermList local_a0;
  TermList local_98;
  uint64_t local_90;
  uint64_t local_88;
  Clause *local_80;
  uint local_78;
  uint local_74;
  TermList local_50;
  TermList local_48;
  undefined8 local_40;
  undefined8 local_38;
  byte local_2d;
  Clause *local_20;
  byte local_11;
  Clause *local_10;
  
  local_11 = in_DL & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::eager == '\0') &&
     (iVar3 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                   ::eager), iVar3 != 0)) {
    CVar4 = Shell::Options::cnfOnTheFly(Lib::env);
    produceClauses::eager = CVar4 == EAGER;
    __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                         eager);
  }
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::simp == '\0') &&
     (iVar3 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                   ::simp), iVar3 != 0)) {
    CVar4 = Shell::Options::cnfOnTheFly(Lib::env);
    produceClauses::simp = CVar4 == LAZY_SIMP;
    __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                         simp);
  }
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::gen == '\0') &&
     (iVar3 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                   ::gen), iVar3 != 0)) {
    CVar4 = Shell::Options::cnfOnTheFly(Lib::env);
    produceClauses::gen = CVar4 == LAZY_GEN;
    __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                         gen);
  }
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
       simp_except_not_be_off == '\0') &&
     (iVar3 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                   ::simp_except_not_be_off), iVar3 != 0)) {
    CVar4 = Shell::Options::cnfOnTheFly(Lib::env);
    produceClauses::simp_except_not_be_off = CVar4 == LAZY_SIMP_NOT_GEN_BOOL_EQ_OFF;
    __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                         simp_except_not_be_off);
  }
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
       simp_except_not_and_be == '\0') &&
     (iVar3 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                   ::simp_except_not_and_be), iVar3 != 0)) {
    CVar4 = Shell::Options::cnfOnTheFly(Lib::env);
    produceClauses::simp_except_not_and_be = CVar4 == LAZY_SIMP_NOT_GEN_BOOL_EQ_GEN;
    __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                         simp_except_not_and_be);
  }
  local_525 = 1;
  if ((produceClauses::simp_except_not_be_off & 1U) == 0) {
    local_526 = 0;
    if ((local_11 & 1) == 0) {
      local_526 = produceClauses::simp_except_not_and_be;
    }
    local_525 = local_526;
  }
  local_2d = local_525 & 1;
  if (((local_11 & 1) == 0) ||
     (((produceClauses::eager & 1U) == 0 && ((produceClauses::simp & 1U) == 0)))) {
    if (((local_11 & 1) == 0) && ((produceClauses::gen & 1U) != 0)) {
      Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
    }
    else {
      Kernel::Term::foolTrue();
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffff6c0._content,
                 (Term *)in_stack_fffffffffffff6b8._content);
      Kernel::Term::foolFalse();
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffff6c0._content,
                 (Term *)in_stack_fffffffffffff6b8._content);
      local_48 = Kernel::AtomicSort::boolSort();
      if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::args == '\0') &&
         (iVar3 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                       ::args), iVar3 != 0)) {
        Lib::Stack<Kernel::TermList>::Stack
                  ((Stack<Kernel::TermList> *)in_stack_fffffffffffff6d0._content,
                   (size_t)in_stack_fffffffffffff6c8);
        __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&produceClauses::args,&__dso_handle);
        __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                             ::args);
      }
      Kernel::TermList::TermList(&local_50);
      Lib::Stack<Kernel::Clause_*>::Stack
                ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6d0._content,
                 (size_t)in_stack_fffffffffffff6c8);
      local_74 = Kernel::Clause::length(local_10);
      for (local_78 = 0; local_78 < local_74; local_78 = local_78 + 1) {
        ppLVar6 = Kernel::Clause::operator[](local_10,local_78);
        local_80 = (Clause *)*ppLVar6;
        pTVar7 = Kernel::Term::nthArgument((Term *)local_80,0);
        local_88 = pTVar7->_content;
        pTVar7 = Kernel::Term::nthArgument((Term *)local_80,1);
        local_90 = pTVar7->_content;
        Kernel::TermList::TermList(&local_98);
        Kernel::TermList::TermList(&local_a0);
        local_a8 = local_88;
        bVar2 = ApplicativeHelper::isBool(in_stack_fffffffffffff6d0);
        if (bVar2) {
          local_a0._content = local_88;
          local_98._content = local_90;
LAB_00781b1d:
          local_160 = local_98._content;
          ApplicativeHelper::getHeadAndArgs
                    (in_stack_fffffffffffff6d0,(TermList *)in_stack_fffffffffffff6c8,
                     (TermStack *)in_stack_fffffffffffff6c0._content);
          local_170 = local_50._content;
          local_164 = ApplicativeHelper::getProxy(in_stack_fffffffffffff6b8);
          if ((((local_164 != NOT_PROXY) && (local_164 != IFF)) && (local_164 != XOR)) &&
             ((((local_11 & 1) == 0 || ((produceClauses::gen & 1U) != 0)) || (local_164 == NOT)))) {
            local_180 = local_a0._content;
            bVar2 = ApplicativeHelper::isTrue(in_stack_fffffffffffff6c0);
            uVar5 = Kernel::Literal::polarity((Literal *)0x781c0b);
            local_171 = bVar2 == uVar5;
            if (local_164 == OR) {
              sVar8 = Lib::Stack<Kernel::TermList>::size(&produceClauses::args);
              uVar12 = (undefined2)((ulong)in_stack_fffffffffffff808 >> 0x30);
              if (sVar8 == 2) {
                if ((local_171 & 1) == 0) {
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                  local_1d8 = pTVar7->_content;
                  local_1e0 = local_40;
                  local_1e8 = local_48._content;
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  local_1d0 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,1);
                  local_1f8 = pTVar7->_content;
                  local_200 = local_40;
                  local_208 = local_48._content;
                  local_1f0 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  convert(local_164);
                  local_210 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  convert(local_164);
                  elem = (Clause *)0x0;
                  local_218 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                }
                else {
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                  local_190 = pTVar7->_content;
                  local_198 = local_38;
                  local_1a0 = local_48._content;
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  local_188 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,1);
                  local_1b0 = pTVar7->_content;
                  local_1b8 = local_38;
                  local_1c0 = local_48._content;
                  local_1a8 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  convert(local_164);
                  elem = (Clause *)0x0;
                  local_1c8 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                }
                goto LAB_0078335e;
              }
            }
            if (local_164 == AND) {
              sVar8 = Lib::Stack<Kernel::TermList>::size(&produceClauses::args);
              uVar12 = (undefined2)((ulong)in_stack_fffffffffffff808 >> 0x30);
              if (sVar8 == 2) {
                if ((local_171 & 1) == 0) {
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                  local_278 = pTVar7->_content;
                  local_280 = local_40;
                  local_288 = local_48._content;
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  local_270 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,1);
                  local_298 = pTVar7->_content;
                  local_2a0 = local_40;
                  local_2a8 = local_48._content;
                  local_290 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  convert(local_164);
                  elem = (Clause *)0x0;
                  local_2b0 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                }
                else {
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                  local_228 = pTVar7->_content;
                  local_230 = local_38;
                  local_238 = local_48._content;
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  local_220 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,1);
                  local_248 = pTVar7->_content;
                  local_250 = local_38;
                  local_258 = local_48._content;
                  local_240 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  convert(local_164);
                  local_260 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  convert(local_164);
                  elem = (Clause *)0x0;
                  local_268 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                }
                goto LAB_0078335e;
              }
            }
            if (local_164 == IMP) {
              sVar8 = Lib::Stack<Kernel::TermList>::size(&produceClauses::args);
              uVar12 = (undefined2)((ulong)in_stack_fffffffffffff808 >> 0x30);
              if (sVar8 == 2) {
                if ((local_171 & 1) == 0) {
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,1);
                  local_308 = pTVar7->_content;
                  local_310 = local_38;
                  local_318 = local_48._content;
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  local_300 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                  local_328 = pTVar7->_content;
                  local_330 = local_40;
                  local_338 = local_48._content;
                  local_320 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  convert(local_164);
                  local_340 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  c_00 = local_80;
                  convert(local_164);
                  elem = (Clause *)0x0;
                  local_348 = replaceLits(c_00,(Literal *)local_10,in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                }
                else {
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,1);
                  local_2c0 = pTVar7->_content;
                  local_2c8 = local_40;
                  local_2d0 = local_48._content;
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  local_2b8 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                  local_2e0 = pTVar7->_content;
                  local_2e8 = local_38;
                  local_2f0 = local_48._content;
                  local_2d8 = Kernel::Literal::createEquality
                                        ((bool)uVar11,in_stack_fffffffffffff720,
                                         in_stack_fffffffffffff718,in_stack_fffffffffffff710);
                  convert(local_164);
                  elem = (Clause *)0x0;
                  local_2f8 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                          in_stack_fffffffffffff810,
                                          (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                          in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                  Lib::Stack<Kernel::Clause_*>::push
                            ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                }
                goto LAB_0078335e;
              }
            }
            if ((local_164 == EQUALS) &&
               (in_stack_fffffffffffff810 =
                     (Literal *)Lib::Stack<Kernel::TermList>::size(&produceClauses::args),
               in_stack_fffffffffffff810 == (Literal *)0x2)) {
              pTVar9 = Kernel::TermList::term((TermList *)0x782981);
              uVar12 = (undefined2)((ulong)pTVar9 >> 0x30);
              uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
              TVar10 = Kernel::SortHelper::getResultSort(in_stack_fffffffffffff738);
              local_358 = TVar10._content;
              pTVar9 = Kernel::TermList::term((TermList *)0x7829bf);
              pTVar7 = Kernel::Term::nthArgument(pTVar9,0);
              local_350 = pTVar7->_content;
              pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
              local_368 = pTVar7->_content;
              pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,1);
              local_370 = pTVar7->_content;
              local_378 = local_350;
              local_360 = Kernel::Literal::createEquality
                                    ((bool)uVar11,in_stack_fffffffffffff720,
                                     in_stack_fffffffffffff718,in_stack_fffffffffffff710);
              convert(local_164);
              elem = (Clause *)0x0;
              local_380 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                      in_stack_fffffffffffff810,(InferenceRule)((ushort)uVar12 >> 8)
                                      ,SUB21(uVar12,0),(Literal *)TVar10._content,
                                      in_stack_fffffffffffff830);
              Lib::Stack<Kernel::Clause_*>::push
                        ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
LAB_0078335e:
              Lib::Stack<Kernel::Clause_*>::Iterator::Iterator
                        ((Iterator *)in_stack_fffffffffffff6c0._content,
                         (Stack<Kernel::Clause_*> *)elem);
              it.super_RefIterator._stack =
                   (Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6e8._content;
              it.super_RefIterator._pointer = (Clause **)in_stack_fffffffffffff6e0._content;
              Lib::getUniquePersistentIterator<Lib::Stack<Kernel::Clause*>::Iterator>(it);
              Lib::pvi<Lib::VirtualIterator<Kernel::Clause*>>
                        ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffff6e8._content);
              Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                        ((VirtualIterator<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content);
              goto LAB_007833e8;
            }
            if (local_164 == NOT) {
              sVar8 = Lib::Stack<Kernel::TermList>::size(&produceClauses::args);
              uVar12 = (undefined2)((ulong)in_stack_fffffffffffff808 >> 0x30);
              if (sVar8 != 0) {
                if ((local_171 & 1) == 0) {
                  local_858 = &local_38;
                }
                else {
                  local_858 = &local_40;
                }
                local_388 = *local_858;
                pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                local_398 = pTVar7->_content;
                local_3a0 = local_388;
                local_3a8 = local_48._content;
                local_390 = Kernel::Literal::createEquality
                                      (SUB81(in_stack_fffffffffffff708._content >> 0x38,0),
                                       in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                                       in_stack_fffffffffffff710);
                convert(local_164);
                elem = (Clause *)0x0;
                local_3b0 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                        in_stack_fffffffffffff810,
                                        (InferenceRule)((ushort)uVar12 >> 8),SUB21(uVar12,0),
                                        in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                Lib::Stack<Kernel::Clause_*>::push
                          ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                goto LAB_0078335e;
              }
            }
            if ((local_164 == PI) || (local_164 == SIGMA)) {
              sVar8 = Lib::Stack<Kernel::TermList>::size(&produceClauses::args);
              uVar12 = (undefined2)((ulong)in_stack_fffffffffffff808 >> 0x30);
              if (sVar8 != 0) {
                if ((local_171 & 1) == 0) {
                  local_898 = &local_40;
                }
                else {
                  local_898 = &local_38;
                }
                local_3b8 = *local_898;
                Kernel::TermList::term((TermList *)0x782d81);
                local_3c8 = (uint64_t)Kernel::SortHelper::getResultSort(in_stack_fffffffffffff738);
                pTVar9 = Kernel::TermList::term((TermList *)0x782dbf);
                pTVar7 = Kernel::Term::nthArgument(pTVar9,0);
                local_3c0 = pTVar7->_content;
                Kernel::TermList::TermList(&local_3d0);
                if (((local_164 == PI) && ((local_171 & 1) != 0)) ||
                   ((local_164 == SIGMA && ((local_171 & 1) == 0)))) {
                  local_3d1 = convert(PI);
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  pTVar7 = Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                  local_3e8 = pTVar7->_content;
                  local_3f0 = local_3c0;
                  local_3e0 = (uint64_t)
                              piRemoval(in_stack_fffffffffffff6f8,in_stack_fffffffffffff6e8._content
                                        ,in_stack_fffffffffffff6f0);
                  local_3d0 = (TermList)local_3e0;
                }
                else {
                  local_3f1 = 0;
                  if (local_20 != (Clause *)0x0) {
                    Kernel::TermList::term((TermList *)0x782eed);
                    Kernel::TypedTermList::TypedTermList
                              ((TypedTermList *)in_stack_fffffffffffff6d0._content,
                               in_stack_fffffffffffff6c8);
                    t._sort._content = in_stack_fffffffffffff6e8._content;
                    t.super_TermList._content = in_stack_fffffffffffff6e0._content;
                    Indexing::TermIndex<Indexing::TermWithValue<Kernel::TermList>_>::
                    getGeneralizations(in_stack_fffffffffffff6d8,t,
                                       SUB81(in_stack_fffffffffffff6d0._content >> 0x38,0));
                    bVar2 = Lib::
                            VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
                            ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
                                       *)0x782f45);
                    if (bVar2) {
                      Lib::
                      VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
                      ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
                              *)in_stack_fffffffffffff6b8._content);
                      uVar1 = *(undefined8 *)(local_418 + 0x10);
                      in_stack_fffffffffffff720._content =
                           (uint64_t)
                           Lib::SmartPtr<Indexing::ResultSubstitution>::operator->(&local_428);
                      iVar3 = (*((ResultSubstitution *)in_stack_fffffffffffff720._content)->
                                _vptr_ResultSubstitution[0xf])
                                        (in_stack_fffffffffffff720._content,uVar1);
                      in_stack_fffffffffffff718._content = CONCAT44(extraout_var,iVar3);
                      in_stack_fffffffffffff710._content =
                           (uint64_t)
                           Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0);
                      in_stack_fffffffffffff708 =
                           ApplicativeHelper::createAppTerm
                                     (in_stack_fffffffffffff708,in_stack_fffffffffffff700,
                                      in_stack_fffffffffffff6f8);
                      local_3f1 = 1;
                      local_3d0 = in_stack_fffffffffffff708;
                      Indexing::
                      QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
                      ::~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
                                   *)0x78307e);
                    }
                    Lib::
                    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
                    ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
                                        *)in_stack_fffffffffffff6c0._content);
                  }
                  if ((local_3f1 & 1) == 0) {
                    TVar10._content =
                         (uint64_t)Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0)
                    ;
                    arg2 = sigmaRemoval(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
                    if (local_20 != (Clause *)0x0) {
                      Kernel::TermList::term((TermList *)0x78316d);
                      Kernel::TypedTermList::TypedTermList
                                ((TypedTermList *)in_stack_fffffffffffff6d0._content,
                                 in_stack_fffffffffffff6c8);
                      Indexing::SkolemisingFormulaIndex::insertFormula
                                ((SkolemisingFormulaIndex *)TVar10._content,
                                 in_stack_fffffffffffff710,in_stack_fffffffffffff708);
                      in_stack_fffffffffffff6e8._content = (uint64_t)local_20;
                    }
                    in_stack_fffffffffffff6e0._content =
                         (uint64_t)Lib::Stack<Kernel::TermList>::operator[](&produceClauses::args,0)
                    ;
                    local_3d0 = ApplicativeHelper::createAppTerm
                                          (in_stack_fffffffffffff708,TVar10,arg2);
                  }
                  uVar11 = (undefined1)(in_stack_fffffffffffff708._content >> 0x38);
                  local_3d1 = convert(SIGMA);
                }
                Kernel::Literal::createEquality
                          ((bool)uVar11,in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                           in_stack_fffffffffffff710);
                elem = (Clause *)0x0;
                replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                            in_stack_fffffffffffff810,(InferenceRule)((ushort)uVar12 >> 8),
                            SUB21(uVar12,0),in_stack_fffffffffffff800,in_stack_fffffffffffff830);
                Lib::Stack<Kernel::Clause_*>::push
                          ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
                goto LAB_0078335e;
              }
            }
          }
        }
        else {
          local_b0 = local_90;
          bVar2 = ApplicativeHelper::isBool(in_stack_fffffffffffff6d0);
          if (bVar2) {
            local_a0._content = local_90;
            local_98._content = local_88;
            goto LAB_00781b1d;
          }
          local_b8 = Kernel::SortHelper::getEqualityArgumentSort
                               ((Literal *)in_stack_fffffffffffff6d8);
          bVar2 = Kernel::TermList::operator==(&local_b8,&local_48);
          uVar12 = (undefined2)((ulong)in_stack_fffffffffffff808 >> 0x30);
          local_532 = 0;
          if (bVar2) {
            local_532 = local_2d ^ 0xff;
          }
          if ((local_532 & 1) != 0) {
            local_c8 = local_88;
            local_d0 = local_38;
            local_d8 = local_48._content;
            local_c0 = Kernel::Literal::createEquality
                                 (SUB81(in_stack_fffffffffffff708._content >> 0x38,0),
                                  in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                                  in_stack_fffffffffffff710);
            local_e8 = local_88;
            local_f0 = local_40;
            local_f8 = local_48._content;
            bVar2 = SUB81(in_stack_fffffffffffff708._content >> 0x38,0);
            local_e0 = Kernel::Literal::createEquality
                                 (bVar2,in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                                  in_stack_fffffffffffff710);
            local_108 = local_90;
            local_110 = local_38;
            local_118 = local_48._content;
            local_100 = Kernel::Literal::createEquality
                                  (bVar2,in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                                   in_stack_fffffffffffff710);
            local_128 = local_90;
            local_130 = local_40;
            local_138 = local_48._content;
            local_120 = Kernel::Literal::createEquality
                                  (bVar2,in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                                   in_stack_fffffffffffff710);
            iVar3 = Kernel::Literal::polarity((Literal *)0x781865);
            if (iVar3 == 0) {
              convert(XOR);
              local_150 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                      in_stack_fffffffffffff810,(InferenceRule)((ushort)uVar12 >> 8)
                                      ,SUB21(uVar12,0),in_stack_fffffffffffff800,
                                      in_stack_fffffffffffff830);
              convert(XOR);
              elem = (Clause *)0x0;
              local_158 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                      in_stack_fffffffffffff810,(InferenceRule)((ushort)uVar12 >> 8)
                                      ,SUB21(uVar12,0),in_stack_fffffffffffff800,
                                      in_stack_fffffffffffff830);
              Lib::Stack<Kernel::Clause_*>::push
                        ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
              Lib::Stack<Kernel::Clause_*>::push
                        ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
            }
            else {
              convert(IFF);
              local_140 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                      in_stack_fffffffffffff810,(InferenceRule)((ushort)uVar12 >> 8)
                                      ,SUB21(uVar12,0),in_stack_fffffffffffff800,
                                      in_stack_fffffffffffff830);
              convert(IFF);
              elem = (Clause *)0x0;
              local_148 = replaceLits(in_stack_fffffffffffff820,in_stack_fffffffffffff818,
                                      in_stack_fffffffffffff810,(InferenceRule)((ushort)uVar12 >> 8)
                                      ,SUB21(uVar12,0),in_stack_fffffffffffff800,
                                      in_stack_fffffffffffff830);
              Lib::Stack<Kernel::Clause_*>::push
                        ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
              Lib::Stack<Kernel::Clause_*>::push
                        ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content,elem);
            }
            goto LAB_0078335e;
          }
        }
      }
      Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
LAB_007833e8:
      Lib::Stack<Kernel::Clause_*>::~Stack
                ((Stack<Kernel::Clause_*> *)in_stack_fffffffffffff6c0._content);
    }
  }
  else {
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  }
  return (ClauseIterator)in_RDI;
}

Assistant:

ClauseIterator produceClauses(Clause* c, bool generating, SkolemisingFormulaIndex* index)
{
  static bool eager = env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER;
  static bool simp = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP;
  static bool gen = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_GEN;
  static bool simp_except_not_be_off = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_OFF;
  static bool simp_except_not_and_be = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_GEN;
  bool not_be = simp_except_not_be_off || (!generating && simp_except_not_and_be);


  if(generating && (eager || simp)){ return ClauseIterator::getEmpty(); }
  if(!generating && gen){ return ClauseIterator::getEmpty(); }

  TermList troo = TermList(Term::foolTrue());
  TermList fols = TermList(Term::foolFalse());
  TermList boolSort = AtomicSort::boolSort();

  static TermStack args;
  TermList head;
 
  ClauseStack resultStack;
  unsigned clength = c->length();

  for(unsigned i = 0; i < clength; i++){
    Literal* lit = (*c)[i];
    TermList lhs = *lit->nthArgument(0);
    TermList rhs = *lit->nthArgument(1);
    TermList term;
    TermList boolVal;
    if(AH::isBool(lhs)){
      boolVal = lhs;
      term = rhs;
    } else if(AH::isBool(rhs)){
      boolVal = rhs;
      term = lhs;
    } else if(SortHelper::getEqualityArgumentSort(lit) == boolSort && !not_be) {
      //equality or diseqality between boolean terms
      Literal* lhsTroo = Literal::createEquality(true, lhs, troo, boolSort);
      Literal* lhsFols = Literal::createEquality(true, lhs, fols, boolSort);
      Literal* rhsTroo = Literal::createEquality(true, rhs, troo, boolSort);
      Literal* rhsFols = Literal::createEquality(true, rhs, fols, boolSort);
      if(lit->polarity()){
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::IFF), true, rhsFols);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::IFF), true, rhsTroo);
        resultStack.push(res1);
        resultStack.push(res2);
      } else {
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::XOR), true, rhsTroo);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::XOR), true, rhsFols);
        resultStack.push(res1);
        resultStack.push(res2);
      }
      goto afterLoop;
    } else {
      continue;
    }

    AH::getHeadAndArgs(term, head, args);
    Signature::Proxy prox = AH::getProxy(head);
    if(prox == Signature::NOT_PROXY || prox == Signature::IFF ||
       prox == Signature::XOR){
      continue;
    }

    if(generating && !gen && prox != Signature::NOT){
      continue;
    }

    bool positive = AH::isTrue(boolVal) == lit->polarity();

    if((prox == Signature::OR) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }
  
    if((prox == Signature::AND) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      }
    }

    if((prox == Signature::IMP) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[1], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[0], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);        
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }

    if((prox == Signature::EQUALS) && (args.size() == 2)){
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      Literal* l1 = Literal::createEquality(positive, args[0], args[1], srt);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::NOT) && (args.size())){
      TermList rhs = positive ? fols : troo;
      Literal* l1 = Literal::createEquality(true, args[0], rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::PI || prox == Signature::SIGMA ) && (args.size())){
      TermList rhs = positive ? troo : fols; 
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      TermList newTerm;
      InferenceRule rule;
      if((prox == Signature::PI && positive) || 
         (prox == Signature::SIGMA && !positive)){
        rule = convert(Signature::PI);
        newTerm = piRemoval(args[0], c, srt);
      } else {
        ASS(term.isTerm());
        bool newTermCreated = false;
        if(index){
          auto results = index->getGeneralizations(TypedTermList(term.term()), true);
          if(results.hasNext()){
            auto tqr = results.next();
            TermList skolemTerm = tqr.data->value;
            skolemTerm = tqr.unifier->applyToBoundResult(skolemTerm);
            newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
            newTermCreated = true;
          }
        }
        if(!newTermCreated){
          TermList skolemTerm = sigmaRemoval(args[0], srt);
          if(index){
            index->insertFormula(TypedTermList(term.term()), skolemTerm);
          }
          newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
        }
        rule = convert(Signature::SIGMA);
      }
      Literal* l1 = Literal::createEquality(true, newTerm, rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, rule, false);
      resultStack.push(res);
      goto afterLoop;
    }

  }
  
  return ClauseIterator::getEmpty(); 

afterLoop:  

  return pvi(getUniquePersistentIterator(ClauseStack::Iterator(resultStack)));

}